

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recognition.cpp
# Opt level: O2

size_t TUPU::write_memory(void *contents,size_t size,size_t nmemb,void *userp)

{
  void *pvVar1;
  size_t __n;
  long lVar2;
  
  __n = size * nmemb;
  pvVar1 = realloc(*userp,__n + *(long *)((long)userp + 8) + 1);
  *(void **)userp = pvVar1;
  if (pvVar1 == (void *)0x0) {
    fwrite("not enough memory (realloc returned NULL)\n",0x2a,1,errStream);
    __n = 0;
  }
  else {
    lVar2 = *(long *)((long)userp + 8);
    memcpy((void *)((long)pvVar1 + lVar2),contents,__n);
    lVar2 = lVar2 + __n;
    *(long *)((long)userp + 8) = lVar2;
    *(undefined1 *)((long)pvVar1 + lVar2) = 0;
  }
  return __n;
}

Assistant:

static
size_t write_memory(void *contents, size_t size, size_t nmemb, void *userp)
{
    size_t realsize = size * nmemb;
    MemChunk *mem = (MemChunk *)userp;

    mem->memory = (char*)realloc(mem->memory, mem->size + realsize + 1);
    if(mem->memory == NULL)
    {
        /* out of memory! */ 
        fprintf(errStream, "not enough memory (realloc returned NULL)\n");
        return 0;
    }
 
    memcpy(&(mem->memory[mem->size]), contents, realsize);
    mem->size += realsize;
    mem->memory[mem->size] = 0;
 
    return realsize;
}